

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp.cc
# Opt level: O2

map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
* __thiscall duckdb_re2::Regexp::CaptureNames_abi_cxx11_(Regexp *this)

{
  map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *pmVar1;
  CaptureNamesWalker w;
  CaptureNamesWalker CStack_78;
  
  CaptureNamesWalker::CaptureNamesWalker(&CStack_78);
  Walker<int>::Walk(&CStack_78.super_Walker<int>,this,0);
  pmVar1 = CStack_78.map_;
  CStack_78.map_ =
       (map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        *)0x0;
  CaptureNamesWalker::~CaptureNamesWalker(&CStack_78);
  return pmVar1;
}

Assistant:

std::map<int, std::string>* Regexp::CaptureNames() {
  CaptureNamesWalker w;
  w.Walk(this, 0);
  return w.TakeMap();
}